

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

bool __thiscall GGWave::decode(GGWave *this,void *data,uint32_t nBytes)

{
  uchar *puVar1;
  float *pfVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t __size;
  ulong uVar7;
  char *__ptr;
  float *pfVar8;
  ulong uVar9;
  uint uVar10;
  float factor;
  
  if (this->m_isRxEnabled == false) {
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Rx is disabled - cannot receive data with this GGWave instance\n";
    __size = 0x3f;
  }
  else {
    if ((this->m_tx).hasData != true) {
      factor = this->m_sampleRateInp / this->m_sampleRate;
      do {
        iVar4 = (this->m_rx).samplesNeeded;
        if (this->m_needResampling == true) {
          iVar4 = Resampler::resample(&this->m_resampler,1.0 / factor,iVar4,
                                      (this->m_rx).amplitudeResampled.m_data,(float *)0x0);
          iVar4 = iVar4 + 4;
        }
        uVar6 = iVar4 * this->m_sampleSizeInp;
        if (nBytes < uVar6) {
          uVar6 = nBytes;
        }
        if (uVar6 == 0) {
          bVar3 = false;
        }
        else {
          if (this->m_sampleFormatInp - GGWAVE_SAMPLE_FORMAT_U8 < 4) {
            pfVar8 = (float *)(this->m_rx).amplitudeTmp.m_data;
LAB_001063d3:
            memcpy(pfVar8,data,(ulong)uVar6);
          }
          else if (this->m_sampleFormatInp == GGWAVE_SAMPLE_FORMAT_F32) {
            pfVar8 = (this->m_rx).amplitudeResampled.m_data;
            goto LAB_001063d3;
          }
          uVar9 = (ulong)uVar6 / (ulong)(uint)this->m_sampleSizeInp;
          if (uVar6 % (uint)this->m_sampleSizeInp == 0) {
            iVar4 = (int)uVar9;
            switch(this->m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_U8:
              if (0 < iVar4) {
                puVar1 = (this->m_rx).amplitudeTmp.m_data;
                pfVar8 = (this->m_rx).amplitudeResampled.m_data;
                uVar7 = 0;
                do {
                  pfVar8[uVar7] = (float)(int)(puVar1[uVar7] - 0x80) * 0.0078125;
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar9);
              }
              break;
            case GGWAVE_SAMPLE_FORMAT_I8:
              if (0 < iVar4) {
                puVar1 = (this->m_rx).amplitudeTmp.m_data;
                pfVar8 = (this->m_rx).amplitudeResampled.m_data;
                uVar7 = 0;
                do {
                  pfVar8[uVar7] = (float)(int)(char)puVar1[uVar7] * 0.0078125;
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar9);
              }
              break;
            case GGWAVE_SAMPLE_FORMAT_U16:
              if (0 < iVar4) {
                puVar1 = (this->m_rx).amplitudeTmp.m_data;
                pfVar8 = (this->m_rx).amplitudeResampled.m_data;
                uVar7 = 0;
                do {
                  pfVar8[uVar7] =
                       (float)(int)(*(ushort *)(puVar1 + uVar7 * 2) - 0x8000) * 3.0517578e-05;
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar9);
              }
              break;
            case GGWAVE_SAMPLE_FORMAT_I16:
              if (0 < iVar4) {
                puVar1 = (this->m_rx).amplitudeTmp.m_data;
                pfVar8 = (this->m_rx).amplitudeResampled.m_data;
                uVar7 = 0;
                do {
                  pfVar8[uVar7] = (float)(int)*(short *)(puVar1 + uVar7 * 2) * 3.0517578e-05;
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar9);
              }
            }
            iVar5 = this->m_samplesPerFrame;
            uVar10 = iVar5 - (this->m_rx).samplesNeeded;
            if (this->m_needResampling == false) {
              if (0 < iVar4) {
                pfVar8 = (this->m_rx).amplitude.m_data;
                pfVar2 = (this->m_rx).amplitudeResampled.m_data;
                uVar7 = 0;
                do {
                  pfVar8[(int)(uVar10 + (int)uVar7)] = pfVar2[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar9);
              }
LAB_0010665f:
              iVar5 = this->m_samplesPerFrame - iVar4;
              if (iVar5 != 0 && iVar4 <= this->m_samplesPerFrame) goto LAB_0010640c;
              (this->m_rx).hasNewAmplitude = true;
              if (this->m_isFixedPayloadLength == true) {
                decode_fixed(this);
              }
              else {
                decode_variable(this);
              }
              iVar5 = this->m_samplesPerFrame;
              uVar10 = iVar4 - iVar5;
              if (uVar10 != 0 && iVar5 <= iVar4) {
                pfVar8 = (this->m_rx).amplitude.m_data;
                uVar9 = 0;
                do {
                  pfVar8[uVar9] = pfVar8[(long)iVar5 + uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar10 != uVar9);
              }
              iVar5 = iVar5 - uVar10;
              bVar3 = true;
            }
            else {
              if (0x80 < iVar4) {
                if (((this->m_rx).receiving == false) &&
                   (this->m_sampleRate * factor * 60.0 <
                    (float)(this->m_resampler).m_state.nSamplesTotal)) {
                  (this->m_resampler).m_state.nSamplesTotal = 0;
                  (this->m_resampler).m_state.timeInt = 0;
                  *(undefined8 *)&(this->m_resampler).m_state.timeLast = 0;
                  (this->m_resampler).m_state.timeNow = 0.0;
                  memset((this->m_resampler).m_edgeSamples.m_data,0,
                         (long)(this->m_resampler).m_edgeSamples.m_size << 2);
                  memset((this->m_resampler).m_delayBuffer.m_data,0,
                         (long)(this->m_resampler).m_delayBuffer.m_size << 2);
                  memset((this->m_resampler).m_samplesInp.m_data,0,
                         (long)(this->m_resampler).m_samplesInp.m_size << 2);
                }
                iVar4 = Resampler::resample(&this->m_resampler,factor,iVar4,
                                            (this->m_rx).amplitudeResampled.m_data,
                                            (this->m_rx).amplitude.m_data + uVar10);
                iVar4 = iVar4 + uVar10;
                goto LAB_0010665f;
              }
              bVar3 = false;
            }
          }
          else {
            if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
              fprintf((anonymous_namespace)::g_fptr,
                      "Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n"
                      ,(ulong)uVar6);
            }
            iVar5 = this->m_samplesPerFrame;
LAB_0010640c:
            bVar3 = false;
          }
          data = (void *)((long)data + (ulong)uVar6);
          nBytes = nBytes - uVar6;
          (this->m_rx).samplesNeeded = iVar5;
        }
        if (!bVar3) {
          return true;
        }
      } while( true );
    }
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Cannot decode while transmitting\n";
    __size = 0x21;
  }
  fwrite(__ptr,__size,1,(anonymous_namespace)::g_fptr);
  return false;
}

Assistant:

bool GGWave::decode(const void * data, uint32_t nBytes) {
    if (m_isRxEnabled == false) {
        ggprintf("Rx is disabled - cannot receive data with this GGWave instance\n");
        return false;
    }

    if (m_tx.hasData) {
        ggprintf("Cannot decode while transmitting\n");
        return false;
    }

    auto dataBuffer = (uint8_t *) data;
    const float factor = m_sampleRateInp/m_sampleRate;

    while (true) {
        // read capture data
        uint32_t nBytesNeeded = m_rx.samplesNeeded*m_sampleSizeInp;

        if (m_needResampling) {
            // note : predict 4 extra samples just to make sure we have enough data
            nBytesNeeded = (m_resampler.resample(1.0f/factor, m_rx.samplesNeeded, m_rx.amplitudeResampled.data(), nullptr) + 4)*m_sampleSizeInp;
        }

        const uint32_t nBytesRecorded = GG_MIN(nBytes, nBytesNeeded);

        if (nBytesRecorded == 0) {
            break;
        }

        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
            case GGWAVE_SAMPLE_FORMAT_I8:
            case GGWAVE_SAMPLE_FORMAT_U16:
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    memcpy(m_rx.amplitudeTmp.data(), dataBuffer, nBytesRecorded);
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    memcpy(m_rx.amplitudeResampled.data(), dataBuffer, nBytesRecorded);
                } break;
        }

        dataBuffer += nBytesRecorded;
        nBytes -= nBytesRecorded;

        if (nBytesRecorded % m_sampleSizeInp != 0) {
            ggprintf("Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n",
                    nBytesRecorded, m_sampleSizeInp);
            m_rx.samplesNeeded = m_samplesPerFrame;
            break;
        }

        // convert to 32-bit float
        int nSamplesRecorded = nBytesRecorded/m_sampleSizeInp;
        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<uint8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int16_t(*(p + i)) - 128)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<int8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<uint16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int32_t(*(p + i)) - 32768)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<int16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32: break;
        }

        uint32_t offset = m_samplesPerFrame - m_rx.samplesNeeded;

        if (m_needResampling) {
            if (nSamplesRecorded <= 2*Resampler::kWidth) {
                m_rx.samplesNeeded = m_samplesPerFrame;
                break;
            }

            // reset resampler state every minute
            if (!m_rx.receiving && m_resampler.nSamplesTotal() > 60.0f*factor*m_sampleRate) {
                m_resampler.reset();
            }

            int nSamplesResampled = offset + m_resampler.resample(factor, nSamplesRecorded, m_rx.amplitudeResampled.data(), m_rx.amplitude.data() + offset);
            nSamplesRecorded = nSamplesResampled;
        } else {
            for (int i = 0; i < nSamplesRecorded; ++i) {
                m_rx.amplitude[offset + i] = m_rx.amplitudeResampled[i];
            }
        }

        // we have enough bytes to do analysis
        if (nSamplesRecorded >= m_samplesPerFrame) {
            m_rx.hasNewAmplitude = true;

            if (m_isFixedPayloadLength) {
                decode_fixed();
            } else {
                decode_variable();
            }

            int nExtraSamples = nSamplesRecorded - m_samplesPerFrame;
            for (int i = 0; i < nExtraSamples; ++i) {
                m_rx.amplitude[i] = m_rx.amplitude[m_samplesPerFrame + i];
            }

            m_rx.samplesNeeded = m_samplesPerFrame - nExtraSamples;
        } else {
            m_rx.samplesNeeded = m_samplesPerFrame - nSamplesRecorded;
            break;
        }
    }

    return true;
}